

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::SourceBuffer>::emplace_back<slang::SourceBuffer_const&>
          (SmallVectorBase<slang::SourceBuffer> *this,SourceBuffer *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  size_t sVar5;
  char *pcVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pSVar10;
  pointer pSVar11;
  BufferID BVar12;
  undefined4 uVar13;
  pointer pSVar14;
  long lVar15;
  long lVar16;
  pointer __src;
  ulong uVar17;
  long lVar18;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    sVar5 = (args->data)._M_len;
    pcVar6 = (args->data)._M_str;
    BVar12.id = (args->id).id;
    uVar13 = *(undefined4 *)&args->field_0x1c;
    __src->library = args->library;
    __src->id = (BufferID)BVar12.id;
    *(undefined4 *)&__src->field_0x1c = uVar13;
    (__src->data)._M_len = sVar5;
    (__src->data)._M_str = pcVar6;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x3ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar17 = this->len + 1;
  uVar4 = this->cap;
  if (uVar17 < uVar4 * 2) {
    uVar17 = uVar4 * 2;
  }
  if (0x3ffffffffffffff - uVar4 < uVar4) {
    uVar17 = 0x3ffffffffffffff;
  }
  lVar18 = (long)__src - (long)this->data_;
  pSVar14 = (pointer)operator_new(uVar17 << 5);
  sVar5 = (args->data)._M_len;
  pcVar6 = (args->data)._M_str;
  uVar7 = *(undefined8 *)&args->id;
  puVar1 = (undefined8 *)((long)pSVar14 + lVar18 + 0x10);
  *puVar1 = args->library;
  puVar1[1] = uVar7;
  *(size_t *)((long)pSVar14 + lVar18) = sVar5;
  ((size_t *)((long)pSVar14 + lVar18))[1] = (size_t)pcVar6;
  p = this->data_;
  lVar15 = this->len * 0x20;
  lVar16 = (long)p + (lVar15 - (long)__src);
  pSVar10 = p;
  pSVar11 = pSVar14;
  if (lVar16 == 0) {
    if (this->len != 0) {
      lVar16 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(p->data)._M_len + lVar16);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)((long)&p->library + lVar16);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pSVar14->library + lVar16);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)&(pSVar14->data)._M_len + lVar16);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        lVar16 = lVar16 + 0x20;
      } while (lVar15 != lVar16);
    }
  }
  else {
    for (; pSVar10 != __src; pSVar10 = pSVar10 + 1) {
      sVar5 = (pSVar10->data)._M_len;
      pcVar6 = (pSVar10->data)._M_str;
      BVar12.id = (pSVar10->id).id;
      uVar13 = *(undefined4 *)&pSVar10->field_0x1c;
      pSVar11->library = pSVar10->library;
      pSVar11->id = (BufferID)BVar12.id;
      *(undefined4 *)&pSVar11->field_0x1c = uVar13;
      (pSVar11->data)._M_len = sVar5;
      (pSVar11->data)._M_str = pcVar6;
      pSVar11 = pSVar11 + 1;
    }
    memcpy((void *)((long)pSVar14 + lVar18 + 0x20),__src,
           (lVar16 - 0x20U & 0xffffffffffffffe0) + 0x20);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar17;
  this->data_ = pSVar14;
  return (reference)((long)pSVar14 + lVar18);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }